

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cc
# Opt level: O0

void __thiscall re2::Regexp::ParseState::~ParseState(ParseState *this)

{
  Regexp *pRVar1;
  string *this_00;
  RegexpOp RVar2;
  long in_RDI;
  Regexp *re;
  Regexp *next;
  Regexp *in_stack_00000030;
  Regexp *local_18;
  
  local_18 = *(Regexp **)(in_RDI + 0x20);
  while (local_18 != (Regexp *)0x0) {
    pRVar1 = local_18->down_;
    local_18->down_ = (Regexp *)0x0;
    RVar2 = Regexp::op(local_18);
    if ((RVar2 == (kRegexpCharClass|kRegexpEmptyMatch)) &&
       (this_00 = (local_18->field_7).field_1.name_, this_00 != (string *)0x0)) {
      std::__cxx11::string::~string((string *)this_00);
      operator_delete(this_00);
    }
    Decref(in_stack_00000030);
    local_18 = pRVar1;
  }
  return;
}

Assistant:

Regexp::ParseState::~ParseState() {
  Regexp* next;
  for (Regexp* re = stacktop_; re != NULL; re = next) {
    next = re->down_;
    re->down_ = NULL;
    if (re->op() == kLeftParen)
      delete re->name_;
    re->Decref();
  }
}